

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O3

void core::image::gamma_correct(Ptr *image,float power)

{
  element_type *peVar1;
  pointer puVar2;
  invalid_argument *this;
  int i;
  long lVar3;
  float fVar4;
  uchar auStack_128 [8];
  uint8_t lookup [256];
  
  if ((image->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    lVar3 = 0;
    do {
      fVar4 = powf((float)(int)lVar3 / 255.0,power);
      auStack_128[lVar3] = (char)(int)(fVar4 * 255.0 + 0.5);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    peVar1 = (image->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    puVar2 = (peVar1->super_TypedImageBase<unsigned_char>).data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < *(int *)((long)&(peVar1->super_TypedImageBase<unsigned_char>).data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data + 8) - (int)puVar2) {
      lVar3 = 0;
      do {
        puVar2[lVar3] = auStack_128[puVar2[lVar3]];
        lVar3 = lVar3 + 1;
        peVar1 = (image->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr;
        puVar2 = (peVar1->super_TypedImageBase<unsigned_char>).data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (lVar3 < *(int *)((long)&(peVar1->super_TypedImageBase<unsigned_char>).data.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data + 8) - (int)puVar2);
    }
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Null image given");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
gamma_correct (ByteImage::Ptr image, float power)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    uint8_t lookup[256];
    for (int i = 0; i < 256; ++i)
        lookup[i] = static_cast<uint8_t>(std::pow(i / 255.0f, power)
            * 255.0f + 0.5f);
    for (int i = 0; i < image->get_value_amount(); ++i)
        image->at(i) = lookup[image->at(i)];
}